

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

_Bool al_fclose(ALLEGRO_FILE *f)

{
  byte bVar1;
  byte bVar2;
  _Bool _Var3;
  long *in_RDI;
  _Bool ret;
  void *unaff_retaddr;
  undefined7 in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffffc;
  
  if (in_RDI == (long *)0x0) {
    al_set_errno(0);
    _Var3 = false;
  }
  else {
    bVar1 = (**(code **)(*in_RDI + 8))(in_RDI);
    bVar2 = bVar1 & 1;
    al_free_with_context
              (unaff_retaddr,in_stack_fffffffffffffffc,(char *)in_RDI,
               (char *)(CONCAT17(bVar1,in_stack_ffffffffffffffe8) & 0x1ffffffffffffff));
    _Var3 = (_Bool)(bVar2 & 1);
  }
  return _Var3;
}

Assistant:

bool al_fclose(ALLEGRO_FILE *f)
{
   if (f) {
      bool ret = f->vtable->fi_fclose(f);
      al_free(f);
      return ret;
   }

   al_set_errno(EINVAL);
   return false;
}